

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPUDPv4Transmitter::FlushPackets(RTPUDPv4Transmitter *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  RTPMemoryManager *pRVar3;
  
  for (p_Var1 = (this->rawpacketlist).
                super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->rawpacketlist; p_Var1 = p_Var1->_M_next) {
    p_Var2 = p_Var1[1]._M_next;
    pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar3 == (RTPMemoryManager *)0x0) {
      if (p_Var2 != (_List_node_base *)0x0) {
        (**(code **)((long)p_Var2->_M_next + 8))(p_Var2);
      }
    }
    else {
      (**(code **)p_Var2->_M_next)(p_Var2);
      (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,p_Var2);
    }
  }
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::clear
            (&this->rawpacketlist);
  return;
}

Assistant:

void RTPUDPv4Transmitter::FlushPackets()
{
	std::list<RTPRawPacket*>::const_iterator it;

	for (it = rawpacketlist.begin() ; it != rawpacketlist.end() ; ++it)
		RTPDelete(*it,GetMemoryManager());
	rawpacketlist.clear();
}